

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::XFormWidget::drawTranslateHandles(XFormWidget *this)

{
  double *pdVar1;
  pointer pVVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double __x;
  double dVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  Vector3D c;
  undefined1 local_158 [16];
  double local_148;
  double local_138;
  double dStack_130;
  double local_128;
  undefined1 local_118 [16];
  double local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  double local_d8;
  double local_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  double local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  if ((this->target).object != (SceneObject *)0x0) {
    uVar8 = 0;
    if (this->transformedMode != false) {
      uVar8 = ((byte)~this->objectMode & 1) * 2;
    }
    local_138 = (this->center).x;
    dStack_130 = (this->center).y;
    local_128 = (this->center).z;
    dVar3 = (this->bounds).max.x - (this->bounds).min.x;
    dVar16 = (this->bounds).max.y - (this->bounds).min.y;
    dVar4 = (this->bounds).max.z - (this->bounds).min.z;
    glLineWidth(0x41000000);
    glBegin(1);
    if (uVar8 < 3) {
      local_c8 = SQRT(dVar4 * dVar4 + dVar3 * dVar3 + dVar16 * dVar16) * 0.5;
      uStack_c0 = 0;
      local_108 = local_c8 * 0.85;
      uVar7 = (ulong)uVar8;
      uStack_100 = 0;
      local_118._8_4_ = SUB84(local_108,0);
      local_118._0_8_ = local_108;
      local_118._12_4_ = (int)((ulong)local_108 >> 0x20);
      lVar12 = uVar7 * 0x18;
      uVar13 = uVar7;
      do {
        uVar13 = uVar13 + 1;
        pVVar2 = (this->axes).
                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_d8 = *(double *)((long)&pVVar2->z + lVar12) * local_108 + local_128;
        pdVar1 = (double *)((long)&pVVar2->x + lVar12);
        dVar3 = pdVar1[1] * (double)local_118._8_8_ + dStack_130;
        local_e8._8_4_ = SUB84(dVar3,0);
        local_e8._0_8_ = *pdVar1 * (double)local_118._0_8_ + local_138;
        local_e8._12_4_ = (int)((ulong)dVar3 >> 0x20);
        glColor4ubv(*(undefined8 *)
                     ((long)&(((this->axisColors).
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data + lVar12));
        glVertex3dv(&local_138);
        glVertex3dv(local_e8);
        lVar12 = lVar12 + 0x18;
      } while ((int)uVar13 != 3);
      glEnd();
      glBegin(4);
      if (uVar8 < 3) {
        local_88 = local_c8 * 0.5 * 0.15;
        uStack_80 = 0;
        local_98._8_4_ = SUB84(local_88,0);
        local_98._0_8_ = local_88;
        local_98._12_4_ = (int)((ulong)local_88 >> 0x20);
        local_a8._8_4_ = SUB84(local_c8,0);
        local_a8._0_8_ = local_c8;
        local_a8._12_4_ = (int)((ulong)local_c8 >> 0x20);
        do {
          pVVar2 = (this->axes).
                   super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_d8 = pVVar2[uVar7].z * local_c8 + local_128;
          local_e8._8_8_ = pVVar2[uVar7].y * (double)local_a8._8_8_ + dStack_130;
          local_e8._0_8_ = pVVar2[uVar7].x * (double)local_a8._0_8_ + local_138;
          local_148 = pVVar2[uVar7].z * local_108 + local_128;
          dVar3 = pVVar2[uVar7].y * (double)local_118._8_8_ + dStack_130;
          local_158._8_4_ = SUB84(dVar3,0);
          local_158._0_8_ = pVVar2[uVar7].x * (double)local_118._0_8_ + local_138;
          local_158._12_4_ = (int)((ulong)dVar3 >> 0x20);
          uVar13 = uVar7 + 1;
          uVar10 = uVar13 & 0xffffffff;
          if (uVar13 == 3) {
            uVar10 = 0;
          }
          dVar3 = pVVar2[uVar10].z * local_88;
          uVar11 = (ulong)((int)uVar7 - 1);
          if (uVar7 == 0) {
            uVar11 = 2;
          }
          dVar16 = pVVar2[uVar10].x * (double)local_98._0_8_;
          dVar17 = pVVar2[uVar10].y * (double)local_98._8_8_;
          local_b8 = pVVar2[uVar11].x * (double)local_98._0_8_;
          dStack_b0 = pVVar2[uVar11].y * (double)local_98._8_8_;
          dVar4 = pVVar2[uVar11].z * local_88;
          glColor4ubv((this->axisColors).
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar7].
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
          uVar14 = 0;
          uVar15 = 0;
          iVar9 = 1;
          do {
            dVar18 = (double)CONCAT44(uVar15,uVar14) * 6.283185307179586 * 0.125;
            local_f8._0_8_ = dVar18;
            local_d0 = (double)CONCAT44(uVar15,uVar14) + 1.0;
            __x = (double)iVar9 * 6.283185307179586 * 0.125;
            dVar18 = cos(dVar18);
            dVar6 = dVar3 * dVar18 + local_148;
            dVar5 = dVar18 * dVar17 + (double)local_158._8_8_;
            local_78._8_4_ = SUB84(dVar5,0);
            local_78._0_8_ = dVar18 * dVar16 + (double)local_158._0_8_;
            local_78._12_4_ = (int)((ulong)dVar5 >> 0x20);
            dVar18 = sin((double)local_f8._0_8_);
            local_48 = (double)local_78._0_8_ - dVar18 * local_b8;
            dStack_40 = (double)local_78._8_8_ - dVar18 * dStack_b0;
            local_38 = dVar6 - dVar4 * dVar18;
            dVar18 = cos(__x);
            dVar6 = dVar3 * dVar18 + local_148;
            dVar5 = dVar18 * dVar17 + (double)local_158._8_8_;
            local_f8._8_4_ = SUB84(dVar5,0);
            local_f8._0_8_ = dVar18 * dVar16 + (double)local_158._0_8_;
            local_f8._12_4_ = (int)((ulong)dVar5 >> 0x20);
            dVar18 = sin(__x);
            local_68 = (double)local_f8._0_8_ - dVar18 * local_b8;
            dStack_60 = (double)local_f8._8_8_ - dVar18 * dStack_b0;
            local_58 = dVar6 - dVar4 * dVar18;
            glVertex3dv(local_e8);
            glVertex3dv(&local_48);
            glVertex3dv(&local_68);
            glVertex3dv(&local_48);
            glVertex3dv(local_158);
            glVertex3dv(&local_68);
            uVar14 = SUB84(local_d0,0);
            uVar15 = (undefined4)((ulong)local_d0 >> 0x20);
            iVar9 = iVar9 + 1;
          } while (iVar9 != 9);
          uVar7 = uVar13;
        } while (uVar13 != 3);
      }
    }
    else {
      glEnd();
      glBegin(4);
    }
    glEnd();
    if ((this->transformedMode == false) || (this->objectMode == true)) {
      drawCenterHandle(this);
    }
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawTranslateHandles() const {
  const double arrowSize = .15;
  const int nSides = 8;

  if (target.object == nullptr) return;

  int startAxis = (transformedMode && !objectMode) ? 2 : 0;

  Vector3D c = center;
  double r = (bounds.max - bounds.min).norm() / 2.;

  // Draw arrow stems
  glLineWidth(8.);
  glBegin(GL_LINES);
  for (int i = startAxis; i < 3; i++) {
    Vector3D b = c + (1. - arrowSize) * r * axes[i];

    glColor4ubv(&axisColors[i][0]);

    glVertex3dv(&c.x);
    glVertex3dv(&b.x);
  }
  glEnd();

  // Draw arrow heads
  glBegin(GL_TRIANGLES);
  for (int i = startAxis; i < 3; i++) {
    Vector3D a = c + r * axes[i];
    Vector3D b = c + (1. - arrowSize) * r * axes[i];
    Vector3D e0 = r * .5 * arrowSize * axes[(i + 1) % 3];
    Vector3D e1 = r * .5 * arrowSize * axes[(i + 2) % 3];

    glColor4ubv(&axisColors[i][0]);

    for (int j = 0; j < nSides; j++) {
      double theta1 = 2. * M_PI * (double)j / (double)nSides;
      double theta2 = 2. * M_PI * (double)(j + 1) / (double)nSides;
      Vector3D p0 = b + cos(theta1) * e0 - sin(theta1) * e1;
      Vector3D p1 = b + cos(theta2) * e0 - sin(theta2) * e1;

      glVertex3dv(&a.x);
      glVertex3dv(&p0.x);
      glVertex3dv(&p1.x);

      glVertex3dv(&p0.x);
      glVertex3dv(&b.x);
      glVertex3dv(&p1.x);
    }
  }
  glEnd();

  if (!transformedMode || objectMode) drawCenterHandle();
  glLineWidth(1.);
}